

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atoi.h
# Opt level: O2

long jsteemann::atoi_unchecked<long>(char *p,char *e)

{
  long lVar1;
  
  if (p == e) {
    return 0;
  }
  if (*p == '-') {
    lVar1 = atoi_negative_unchecked<long>(p + 1,e);
    return lVar1;
  }
  if (*p == '+') {
    lVar1 = atoi_positive_unchecked<long>(p + 1,e);
    return lVar1;
  }
  lVar1 = 0;
  for (; p != e; p = p + 1) {
    lVar1 = lVar1 * 10 + (long)*p + -0x30;
  }
  return lVar1;
}

Assistant:

inline T atoi_unchecked(char const* p, char const* e) noexcept {
  if (ATOI_UNLIKELY(p == e)) {
    return T();
  }

  if (*p == '-') {
    if (!std::is_signed<T>::value) {
      return T();
    }
    return atoi_negative_unchecked<T>(++p, e);
  } 
  if (ATOI_UNLIKELY(*p == '+')) {
    ++p;
  }
  
  return atoi_positive_unchecked<T>(p, e);
}